

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

void __thiscall
FListMenuItemPatch::FListMenuItemPatch
          (FListMenuItemPatch *this,int x,int y,int height,int hotkey,FTextureID patch,FName *child,
          int param)

{
  FName local_2c;
  int local_28;
  int local_24;
  int hotkey_local;
  int height_local;
  int y_local;
  int x_local;
  FListMenuItemPatch *this_local;
  FTextureID patch_local;
  
  local_28 = hotkey;
  local_24 = height;
  hotkey_local = y;
  height_local = x;
  _y_local = this;
  this_local._4_4_ = patch.texnum;
  FName::FName(&local_2c,child);
  FListMenuItemSelectable::FListMenuItemSelectable
            (&this->super_FListMenuItemSelectable,x,y,height,&local_2c,param);
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItemPatch_009ed8d8;
  FTextureID::FTextureID((FTextureID *)&(this->super_FListMenuItemSelectable).field_0x24);
  (this->super_FListMenuItemSelectable).mHotkey = local_28;
  *(int *)&(this->super_FListMenuItemSelectable).field_0x24 = this_local._4_4_;
  return;
}

Assistant:

FListMenuItemPatch::FListMenuItemPatch(int x, int y, int height, int hotkey, FTextureID patch, FName child, int param)
: FListMenuItemSelectable(x, y, height, child, param)
{
	mHotkey = hotkey;
	mTexture = patch;
}